

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O3

mz_bool tdefl_compress_normal(tdefl_compressor *d)

{
  mz_uint *pmVar1;
  mz_uint8 *pmVar2;
  long lVar3;
  mz_uint16 *pmVar4;
  byte bVar5;
  byte bVar6;
  short sVar7;
  ushort uVar8;
  tdefl_flush tVar9;
  uint uVar10;
  mz_uint mVar11;
  mz_uint8 *pmVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  short sVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  mz_uint mVar26;
  uint uVar27;
  short sVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  byte *pbVar33;
  uint local_9c;
  size_t local_98;
  int local_48;
  int local_40;
  ulong uVar28;
  
  pbVar33 = d->m_pSrc;
  local_98 = d->m_src_buf_left;
  tVar9 = d->m_flush;
  pmVar2 = d->m_dict;
  local_40 = (int)d + 0x92aa;
  do {
    pbVar17 = pbVar33;
    if (local_98 == 0) {
      if ((tVar9 == TDEFL_NO_FLUSH) || (uVar15 = d->m_lookahead_size, uVar15 == 0)) {
        local_98 = 0;
        goto LAB_00132262;
      }
      uVar14 = d->m_dict_size;
      uVar20 = uVar15;
      if (1 < uVar14 + uVar15) goto LAB_0013198d;
      local_98 = 0;
LAB_00131bb5:
      uVar20 = 0x8000 - uVar15;
      if (uVar14 <= 0x8000 - uVar15) {
        uVar20 = uVar14;
      }
      d->m_dict_size = uVar20;
    }
    else {
      uVar20 = d->m_lookahead_size;
      uVar14 = d->m_dict_size;
      if (uVar14 + uVar20 < 2) {
        uVar15 = 0x102;
        if (0x102 < uVar20) {
          uVar15 = uVar20;
        }
        uVar22 = 0;
        do {
          iVar19 = (int)uVar22;
          if (uVar15 - uVar20 == iVar19) {
            pbVar33 = pbVar33 + uVar22;
            local_98 = local_98 - uVar22;
            goto LAB_00131bb5;
          }
          bVar6 = pbVar33[uVar22];
          mVar26 = d->m_lookahead_pos;
          uVar30 = uVar20 + iVar19 + mVar26 & 0x7fff;
          d->m_dict[uVar30] = bVar6;
          if (uVar30 < 0x101) {
            d->m_dict[(ulong)uVar30 + 0x8000] = bVar6;
          }
          d->m_lookahead_size = uVar20 + iVar19 + 1;
          if (2 < uVar20 + uVar14 + 1 + iVar19) {
            uVar31 = (uVar20 - 2) + iVar19 + mVar26 & 0x7fff;
            uVar30 = (uint)bVar6 ^ (uint)d->m_dict[(mVar26 + uVar20 + iVar19) - 1 & 0x7fff] << 5 ^
                     (d->m_dict[uVar31] & 0x1f) << 10;
            d->m_next[uVar31] = d->m_hash[uVar30];
            d->m_hash[uVar30] = ((short)mVar26 + (short)(uVar20 + iVar19)) - 2;
          }
          uVar22 = uVar22 + 1;
        } while (local_98 != uVar22);
        uVar15 = uVar20 + (int)uVar22;
        local_98 = 0;
        pbVar17 = pbVar33 + uVar22;
      }
      else {
LAB_0013198d:
        mVar26 = d->m_lookahead_pos;
        uVar30 = (uVar20 + mVar26) - 2;
        bVar6 = d->m_dict[uVar30 & 0x7fff];
        bVar5 = d->m_dict[(mVar26 + uVar20) - 1 & 0x7fff];
        uVar22 = local_98 & 0xffffffff;
        if (0x102 - uVar20 <= local_98) {
          uVar22 = (ulong)(0x102 - uVar20);
        }
        local_98 = local_98 - uVar22;
        uVar15 = (int)uVar22 + uVar20;
        d->m_lookahead_size = uVar15;
        if ((int)uVar22 != 0) {
          uVar20 = mVar26 + uVar20;
          pbVar17 = pbVar33 + uVar22;
          uVar23 = (ulong)((uint)bVar6 << 5 ^ (uint)bVar5);
          do {
            uVar20 = uVar20 & 0x7fff;
            bVar6 = *pbVar33;
            pmVar2[uVar20] = bVar6;
            if (uVar20 < 0x101) {
              d->m_dict[(ulong)uVar20 + 0x8000] = bVar6;
            }
            pbVar33 = pbVar33 + 1;
            uVar23 = (ulong)(((uint)uVar23 & 0x3ff) << 5 ^ (uint)bVar6);
            d->m_next[uVar30 & 0x7fff] = d->m_hash[uVar23];
            d->m_hash[uVar23] = (mz_uint16)uVar30;
            uVar20 = uVar20 + 1;
            uVar30 = uVar30 + 1;
            uVar22 = uVar22 - 1;
          } while (uVar22 != 0);
        }
      }
      uVar20 = 0x8000 - uVar15;
      if (uVar14 <= 0x8000 - uVar15) {
        uVar20 = uVar14;
      }
      d->m_dict_size = uVar20;
      pbVar33 = pbVar17;
      if ((tVar9 == TDEFL_NO_FLUSH) && (uVar15 < 0x102)) {
LAB_00132262:
        d->m_pSrc = pbVar17;
        d->m_src_buf_left = local_98;
        return 1;
      }
    }
    uVar22 = (ulong)uVar15;
    uVar14 = d->m_saved_match_len;
    uVar30 = uVar14;
    if (uVar14 == 0) {
      uVar30 = 2;
    }
    uVar23 = (ulong)uVar30;
    uVar31 = d->m_flags;
    uVar10 = d->m_lookahead_pos;
    uVar27 = uVar10 & 0x7fff;
    uVar28 = (ulong)uVar27;
    if ((uVar31 & 0x90000) == 0) {
      if (uVar15 <= uVar30) goto LAB_00131e81;
      local_48 = (int)pmVar2 + uVar27;
      mVar26 = d->m_max_probes[0x1f < uVar30];
      lVar3 = (long)d->m_max_probes + (uVar28 - 0x14);
      local_9c = 0;
      uVar24 = uVar28;
      do {
        uVar30 = (uint)uVar23;
        sVar7 = *(short *)(pmVar2 + ((uVar27 - 1) + uVar30));
        iVar19 = uVar30 - 1;
LAB_00131cb4:
        do {
          do {
            mVar26 = mVar26 - 1;
            if ((mVar26 == 0) || (uVar8 = d->m_next[uVar24], uVar8 == 0)) goto LAB_00131ea3;
            uVar21 = uVar10 - uVar8 & 0xffff;
            if (uVar20 < uVar21) goto LAB_00131ea3;
            uVar16 = uVar8 & 0x7fff;
            uVar24 = (ulong)uVar16;
            if (*(short *)(pmVar2 + (iVar19 + uVar16)) != sVar7) {
              uVar8 = d->m_next[uVar24];
              if (uVar8 == 0) goto LAB_00131ea3;
              uVar21 = uVar10 - uVar8 & 0xffff;
              if (uVar20 < uVar21) goto LAB_00131ea3;
              uVar16 = uVar8 & 0x7fff;
              uVar24 = (ulong)uVar16;
              if (*(short *)(pmVar2 + (iVar19 + uVar16)) != sVar7) {
                uVar8 = d->m_next[uVar24];
                if (uVar8 == 0) goto LAB_00131ea3;
                uVar21 = uVar10 - uVar8 & 0xffff;
                if (uVar20 < uVar21) goto LAB_00131ea3;
                uVar16 = uVar8 & 0x7fff;
                uVar24 = (ulong)uVar16;
                if (*(short *)(pmVar2 + (iVar19 + uVar16)) != sVar7) goto LAB_00131cb4;
              }
            }
            if (uVar21 == 0) goto LAB_00131ea3;
          } while (*(short *)(pmVar2 + uVar24) != *(short *)(pmVar2 + uVar28));
          lVar25 = 0;
          while( true ) {
            sVar18 = *(short *)(lVar3 + 0xca + lVar25);
            sVar29 = *(short *)(d->m_dict + lVar25 + uVar24 + 2);
            iVar32 = (int)lVar3;
            iVar13 = (int)lVar25;
            if (sVar18 != sVar29) break;
            sVar18 = *(short *)(lVar3 + 0xcc + lVar25);
            sVar29 = *(short *)(d->m_dict + lVar25 + uVar24 + 4);
            if (sVar18 != sVar29) {
              iVar32 = iVar32 + iVar13 + 0xcc;
              goto LAB_00131e33;
            }
            sVar18 = *(short *)(lVar3 + 0xce + lVar25);
            sVar29 = *(short *)(d->m_dict + lVar25 + uVar24 + 6);
            if (sVar18 != sVar29) {
              iVar32 = iVar32 + iVar13 + 0xce;
              goto LAB_00131e33;
            }
            sVar18 = *(short *)(lVar3 + 0xd0 + lVar25);
            sVar29 = *(short *)(d->m_dict + lVar25 + uVar24 + 8);
            if (sVar18 != sVar29) {
              iVar32 = iVar32 + iVar13 + 0xd0;
              goto LAB_00131e33;
            }
            lVar25 = lVar25 + 8;
            if ((int)lVar25 == 0x100) {
              local_9c = uVar21;
              uVar30 = uVar15;
              if (0x101 < uVar15) {
                uVar30 = 0x102;
              }
              goto LAB_00131ea3;
            }
          }
          iVar32 = iVar32 + iVar13 + 0xca;
LAB_00131e33:
          uVar16 = (uint)((char)sVar18 == (char)sVar29) | iVar32 - local_48 & 0xfffffffeU;
        } while (uVar16 <= uVar30);
        uVar23 = (ulong)uVar16;
        if (uVar15 <= uVar16) {
          uVar23 = uVar22;
        }
        local_9c = uVar21;
        uVar30 = (uint)uVar23;
      } while (uVar15 > uVar16);
    }
    else if ((uVar31 >> 0x13 & 1) == 0 && uVar20 != 0) {
      if (uVar22 == 0) {
        uVar23 = 0;
      }
      else {
        uVar24 = 0;
        do {
          uVar23 = uVar24;
          if (pmVar2[uVar27 + (int)uVar24] != pmVar2[uVar10 - 1 & 0x7fff]) break;
          uVar24 = uVar24 + 1;
          uVar23 = uVar22;
        } while (uVar22 != uVar24);
      }
      uVar30 = (uint)uVar23;
      local_9c = (uint)(2 < uVar30);
      if (2 >= uVar30) {
        uVar30 = 0;
      }
    }
    else {
LAB_00131e81:
      local_9c = 0;
    }
LAB_00131ea3:
    if (((uVar30 == 3 && 0x1fff < local_9c) || (uVar27 == local_9c)) ||
       (((uVar31 >> 0x11 & 1) != 0 && (uVar30 < 6)))) {
      mVar26 = d->m_total_lz_bytes;
      pbVar17 = d->m_pLZ_code_buf;
      if (uVar14 != 0) {
LAB_00131ede:
        mVar11 = d->m_saved_match_dist;
        d->m_total_lz_bytes = mVar26 + uVar14;
        *pbVar17 = (byte)(uVar14 - 3);
        uVar15 = mVar11 - 1;
        d->m_pLZ_code_buf[1] = (mz_uint8)uVar15;
        d->m_pLZ_code_buf[2] = (mz_uint8)(uVar15 >> 8);
        d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
        *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
        pmVar1 = &d->m_num_flags_left;
        *pmVar1 = *pmVar1 - 1;
        if (*pmVar1 == 0) {
          d->m_num_flags_left = 8;
          pmVar12 = d->m_pLZ_code_buf;
          d->m_pLZ_code_buf = pmVar12 + 1;
          d->m_pLZ_flags = pmVar12;
        }
        pbVar17 = "" + (uVar15 >> 8 & 0x7f);
        if (uVar15 < 0x200) {
          pbVar17 = "" + (uVar15 & 0x1ff);
        }
        pmVar4 = d->m_huff_count[1] + *pbVar17;
        *pmVar4 = *pmVar4 + 1;
        if (2 < uVar14) {
          pmVar4 = d->m_huff_count[0] + s_tdefl_len_sym[uVar14 - 3];
          *pmVar4 = *pmVar4 + 1;
        }
        uVar30 = d->m_saved_match_len - 1;
        goto LAB_00131f86;
      }
LAB_00132152:
      bVar6 = d->m_dict[uVar28];
      d->m_total_lz_bytes = mVar26 + 1;
      d->m_pLZ_code_buf = pbVar17 + 1;
      *pbVar17 = bVar6;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar12 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar12 + 1;
        d->m_pLZ_flags = pmVar12;
      }
      pmVar4 = d->m_huff_count[0] + bVar6;
      *pmVar4 = *pmVar4 + 1;
LAB_00132194:
      uVar30 = 1;
    }
    else if (uVar14 == 0) {
      if (local_9c == 0) {
        mVar26 = d->m_total_lz_bytes;
        pbVar17 = d->m_pLZ_code_buf;
        goto LAB_00132152;
      }
      if (((d->m_greedy_parsing == 0) && ((uVar31 >> 0x10 & 1) == 0)) && (uVar30 < 0x80))
      goto LAB_00132224;
      d->m_total_lz_bytes = d->m_total_lz_bytes + uVar30;
      *d->m_pLZ_code_buf = (mz_uint8)(uVar30 - 3);
      uVar15 = local_9c - 1;
      d->m_pLZ_code_buf[1] = (mz_uint8)uVar15;
      d->m_pLZ_code_buf[2] = (mz_uint8)(uVar15 >> 8);
      d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar12 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar12 + 1;
        d->m_pLZ_flags = pmVar12;
      }
      pbVar17 = "" + (uVar15 >> 8 & 0x7f);
      if (local_9c < 0x201) {
        pbVar17 = "" + (uVar15 & 0x1ff);
      }
      pmVar4 = d->m_huff_count[1] + *pbVar17;
      *pmVar4 = *pmVar4 + 1;
      if (2 < uVar30) {
        pmVar4 = d->m_huff_count[0] + s_tdefl_len_sym[uVar30 - 3];
        *pmVar4 = *pmVar4 + 1;
      }
    }
    else {
      mVar26 = d->m_total_lz_bytes;
      pbVar17 = d->m_pLZ_code_buf;
      if (uVar30 <= uVar14) goto LAB_00131ede;
      uVar15 = d->m_saved_lit;
      d->m_total_lz_bytes = mVar26 + 1;
      d->m_pLZ_code_buf = pbVar17 + 1;
      *pbVar17 = (byte)uVar15;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar12 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar12 + 1;
        d->m_pLZ_flags = pmVar12;
      }
      pmVar4 = d->m_huff_count[0] + (uVar15 & 0xff);
      *pmVar4 = *pmVar4 + 1;
      if (uVar30 < 0x80) {
LAB_00132224:
        d->m_saved_lit = (uint)d->m_dict[uVar28];
        d->m_saved_match_dist = local_9c;
        d->m_saved_match_len = uVar30;
        goto LAB_00132194;
      }
      d->m_total_lz_bytes = d->m_total_lz_bytes + uVar30;
      *d->m_pLZ_code_buf = (mz_uint8)(uVar30 - 3);
      local_9c = local_9c - 1;
      d->m_pLZ_code_buf[1] = (mz_uint8)local_9c;
      d->m_pLZ_code_buf[2] = (mz_uint8)(local_9c >> 8);
      d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar12 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar12 + 1;
        d->m_pLZ_flags = pmVar12;
      }
      pbVar17 = "" + (local_9c >> 8 & 0x7f);
      if (local_9c < 0x200) {
        pbVar17 = "" + (local_9c & 0x1ff);
      }
      pmVar4 = d->m_huff_count[1] + *pbVar17;
      *pmVar4 = *pmVar4 + 1;
      pmVar4 = d->m_huff_count[0] + s_tdefl_len_sym[uVar30 - 3];
      *pmVar4 = *pmVar4 + 1;
LAB_00131f86:
      d->m_saved_match_len = 0;
    }
    d->m_lookahead_pos = d->m_lookahead_pos + uVar30;
    d->m_lookahead_size = d->m_lookahead_size - uVar30;
    uVar30 = uVar30 + d->m_dict_size;
    if (0x7fff < uVar30) {
      uVar30 = 0x8000;
    }
    d->m_dict_size = uVar30;
    if ((d->m_lz_code_buf + 0xfff8 < d->m_pLZ_code_buf) ||
       ((0x7c00 < d->m_total_lz_bytes &&
        ((d->m_total_lz_bytes <= (uint)(((int)d->m_pLZ_code_buf - local_40) * 0x73) >> 7 ||
         ((d->m_flags & 0x80000) != 0)))))) {
      d->m_pSrc = pbVar33;
      d->m_src_buf_left = local_98;
      uVar15 = tdefl_flush_block(d,0);
      if (uVar15 != 0) {
        return ~uVar15 >> 0x1f;
      }
    }
  } while( true );
}

Assistant:

static mz_bool tdefl_compress_normal(tdefl_compressor* d) {
  const mz_uint8* pSrc = d->m_pSrc;
  size_t src_buf_left = d->m_src_buf_left;
  tdefl_flush flush = d->m_flush;

  while ((src_buf_left) || ((flush) && (d->m_lookahead_size))) {
    mz_uint len_to_move, cur_match_dist, cur_match_len, cur_pos;
    // Update dictionary and hash chains. Keeps the lookahead size equal to TDEFL_MAX_MATCH_LEN.
    if ((d->m_lookahead_size + d->m_dict_size) >= (TDEFL_MIN_MATCH_LEN - 1)) {
      mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK, ins_pos = d->m_lookahead_pos + d->m_lookahead_size - 2;
      mz_uint hash = (d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK];
      mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(src_buf_left, TDEFL_MAX_MATCH_LEN - d->m_lookahead_size);
      const mz_uint8* pSrc_end = pSrc + num_bytes_to_process;
      src_buf_left -= num_bytes_to_process;
      d->m_lookahead_size += num_bytes_to_process;
      while (pSrc != pSrc_end) {
        mz_uint8 c = *pSrc++;
        d->m_dict[dst_pos] = c;
        if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
          d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
        hash = ((hash << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
        d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
        d->m_hash[hash] = (mz_uint16)(ins_pos);
        dst_pos = (dst_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
        ins_pos++;
      }
    } else {
      while ((src_buf_left) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN)) {
        mz_uint8 c = *pSrc++;
        mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK;
        src_buf_left--;
        d->m_dict[dst_pos] = c;
        if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
          d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
        if ((++d->m_lookahead_size + d->m_dict_size) >= TDEFL_MIN_MATCH_LEN) {
          mz_uint ins_pos = d->m_lookahead_pos + (d->m_lookahead_size - 1) - 2;
          mz_uint hash = ((d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << (TDEFL_LZ_HASH_SHIFT * 2)) ^ (d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
          d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
          d->m_hash[hash] = (mz_uint16)(ins_pos);
        }
      }
    }
    d->m_dict_size = MZ_MIN(TDEFL_LZ_DICT_SIZE - d->m_lookahead_size, d->m_dict_size);
    if ((!flush) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
      break;

    // Simple lazy/greedy parsing state machine.
    len_to_move = 1;
    cur_match_dist = 0;
    cur_match_len = d->m_saved_match_len ? d->m_saved_match_len : (TDEFL_MIN_MATCH_LEN - 1);
    cur_pos = d->m_lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;
    if (d->m_flags & (TDEFL_RLE_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS)) {
      if ((d->m_dict_size) && (!(d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS))) {
        mz_uint8 c = d->m_dict[(cur_pos - 1) & TDEFL_LZ_DICT_SIZE_MASK];
        cur_match_len = 0;
        while (cur_match_len < d->m_lookahead_size) {
          if (d->m_dict[cur_pos + cur_match_len] != c)
            break;
          cur_match_len++;
        }
        if (cur_match_len < TDEFL_MIN_MATCH_LEN)
          cur_match_len = 0;
        else
          cur_match_dist = 1;
      }
    } else {
      tdefl_find_match(d, d->m_lookahead_pos, d->m_dict_size, d->m_lookahead_size, &cur_match_dist, &cur_match_len);
    }
    if (((cur_match_len == TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 8U * 1024U)) || (cur_pos == cur_match_dist) || ((d->m_flags & TDEFL_FILTER_MATCHES) && (cur_match_len <= 5))) {
      cur_match_dist = cur_match_len = 0;
    }
    if (d->m_saved_match_len) {
      if (cur_match_len > d->m_saved_match_len) {
        tdefl_record_literal(d, (mz_uint8)d->m_saved_lit);
        if (cur_match_len >= 128) {
          tdefl_record_match(d, cur_match_len, cur_match_dist);
          d->m_saved_match_len = 0;
          len_to_move = cur_match_len;
        } else {
          d->m_saved_lit = d->m_dict[cur_pos];
          d->m_saved_match_dist = cur_match_dist;
          d->m_saved_match_len = cur_match_len;
        }
      } else {
        tdefl_record_match(d, d->m_saved_match_len, d->m_saved_match_dist);
        len_to_move = d->m_saved_match_len - 1;
        d->m_saved_match_len = 0;
      }
    } else if (!cur_match_dist)
      tdefl_record_literal(d, d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)]);
    else if ((d->m_greedy_parsing) || (d->m_flags & TDEFL_RLE_MATCHES) || (cur_match_len >= 128)) {
      tdefl_record_match(d, cur_match_len, cur_match_dist);
      len_to_move = cur_match_len;
    } else {
      d->m_saved_lit = d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)];
      d->m_saved_match_dist = cur_match_dist;
      d->m_saved_match_len = cur_match_len;
    }
    // Move the lookahead forward by len_to_move bytes.
    d->m_lookahead_pos += len_to_move;
    MZ_ASSERT(d->m_lookahead_size >= len_to_move);
    d->m_lookahead_size -= len_to_move;
    d->m_dict_size = MZ_MIN(d->m_dict_size + len_to_move, TDEFL_LZ_DICT_SIZE);
    // Check if it's time to flush the current LZ codes to the internal output buffer.
    if ((d->m_pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8]) ||
        ((d->m_total_lz_bytes > 31 * 1024) && (((((mz_uint)(d->m_pLZ_code_buf - d->m_lz_code_buf) * 115) >> 7) >= d->m_total_lz_bytes) || (d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS)))) {
      int n;
      d->m_pSrc = pSrc;
      d->m_src_buf_left = src_buf_left;
      if ((n = tdefl_flush_block(d, 0)) != 0)
        return (n < 0) ? MZ_FALSE : MZ_TRUE;
    }
  }

  d->m_pSrc = pSrc;
  d->m_src_buf_left = src_buf_left;
  return MZ_TRUE;
}